

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

void __thiscall Arcflow::Arcflow(Arcflow *this,char *fname)

{
  _Rb_tree_header *p_Var1;
  clock_t cVar2;
  runtime_error *this_00;
  char _error_msg_ [256];
  char acStack_128 [264];
  
  p_Var1 = &(this->AS)._M_t._M_impl.super__Rb_tree_header;
  (this->AS)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AS)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AS)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AS)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AS)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->NS).index._M_t._M_impl.super__Rb_tree_header;
  (this->NS).index._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->NS).index._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->NS).index._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->NS).index._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->dp)._M_t._M_impl.super__Rb_tree_header;
  (this->dp)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->dp)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->NS).index._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->NS).labels.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->NS).labels.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->NS).labels.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->maxW).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->dp)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->dp)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->dp)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->max_label).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->max_label).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->max_label).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->hash_bits).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->max_rep).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->sitems).super__Vector_base<Item,_std::allocator<Item>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->weights).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->weights).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->weights).
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Instance::Instance(&this->inst);
  this->ready = false;
  (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->Ts).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cVar2 = clock();
  this->tstart = cVar2;
  init(this,(EVP_PKEY_CTX *)fname);
  if (this->ready != false) {
    return;
  }
  snprintf(acStack_128,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
           "ready == true",
           "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
           ,0x1b);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,acStack_128);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Arcflow::Arcflow(const char *fname) {
	ready = false;
	tstart = CURTIME;
	init(fname);
	throw_assert(ready == true);
}